

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rst_display_driver.cpp
# Opt level: O3

void __thiscall RstDisplayDriver::display(RstDisplayDriver *this,Document *doc,ostream *output)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  ostream *poVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  stringstream url_data;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  undefined8 local_1f8;
  ulong local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  Document *local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar5 = 0;
  local_1c8 = doc;
  do {
    uVar4 = Document::size();
    if (uVar4 <= uVar5) {
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_228,local_220);
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return;
    }
    local_208 = (long *)Document::operator[]((ulong)doc);
    uVar2 = (**(code **)(*local_208 + 8))();
    cVar1 = (char)output;
    switch(uVar2) {
    case 7:
      lVar7 = 3;
      pcVar13 = "#) ";
      break;
    case 8:
      lVar7 = 2;
      pcVar13 = "- ";
      break;
    default:
      goto switchD_001231ac_caseD_9;
    case 10:
      lVar7 = 4;
      pcVar13 = "    ";
      break;
    case 0xb:
      std::__ostream_insert<char,std::char_traits<char>>(output,"::",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      goto switchD_001231ac_caseD_9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(output,pcVar13,lVar7);
switchD_001231ac_caseD_9:
    local_200 = 0;
    local_1f0 = 0;
    local_1c0 = uVar5;
    while (uVar5 = Paragraph::size(), local_1f0 < uVar5) {
      plVar6 = (long *)Paragraph::operator[]((ulong)local_208);
      if (plVar6 == (long *)0x0) {
        local_1f8 = 1;
        bVar15 = true;
LAB_0012334d:
        lVar8 = 0;
        bVar14 = true;
      }
      else {
        lVar7 = __dynamic_cast(plVar6,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
        lVar8 = __dynamic_cast(plVar6,&LineElement::typeinfo,&UrlLineElement::typeinfo);
        lVar9 = __dynamic_cast(plVar6,&LineElement::typeinfo,&BoldLineElement::typeinfo);
        bVar14 = lVar9 == 0;
        lVar10 = __dynamic_cast(plVar6,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
        uVar11 = CONCAT71((int7)((ulong)lVar10 >> 8),lVar10 == 0);
        bVar15 = lVar7 == 0;
        local_1f8 = uVar11;
        if ((bVar15) || (uVar11 = (**(code **)(*local_208 + 8))(), (int)uVar11 == 0xb)) {
          if (lVar8 == 0) {
            if (lVar9 == 0) {
              if (lVar10 == 0) {
                local_1f8 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(output,"*",1);
                local_1f8 = 0;
              }
              goto LAB_0012334d;
            }
            std::__ostream_insert<char,std::char_traits<char>>(output,"**",2);
            lVar8 = 0;
            bVar14 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(output,"`",1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(output,"``",2);
          bVar15 = false;
        }
      }
      (**(code **)(*plVar6 + 0x10))(&local_228,plVar6);
      lVar7 = local_200 + local_220;
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      (**(code **)(*plVar6 + 0x10))(&local_228,plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_228,local_220);
      local_200 = lVar7;
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (bVar15) {
LAB_0012342f:
        if (lVar8 == 0) {
          pcVar13 = "**";
          if (bVar14 != false) {
            pcVar13 = "*";
          }
          if (((byte)local_1f8 & bVar14) == 0) {
            lVar7 = 2 - (ulong)bVar14;
            goto LAB_0012354f;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(output,"`_",2);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".. _",4);
          (**(code **)(*plVar6 + 0x10))(&local_228,plVar6);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)local_228,local_220);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
          UrlLineElement::url_abi_cxx11_();
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_1e8,local_1e0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
        }
      }
      else {
        iVar3 = (**(code **)(*local_208 + 8))();
        lVar7 = 2;
        pcVar13 = "``";
        if (iVar3 == 0xb) goto LAB_0012342f;
LAB_0012354f:
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar13,lVar7);
      }
      local_1f0 = local_1f0 + 1;
    }
    iVar3 = (**(code **)(*local_208 + 8))();
    uVar5 = local_1c0;
    doc = local_1c8;
    if (iVar3 == 3) {
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
      std::ostream::put(cVar1);
      poVar12 = (ostream *)std::ostream::flush();
      local_228 = local_218;
      std::__cxx11::string::_M_construct((ulong)&local_228,(char)local_200);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_228,local_220);
LAB_001236ee:
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
    }
    else {
      if (iVar3 == 2) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar12 = (ostream *)std::ostream::flush();
        local_228 = local_218;
        std::__cxx11::string::_M_construct((ulong)&local_228,(char)local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_228,local_220);
        goto LAB_001236ee;
      }
      if (iVar3 == 1) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar12 = (ostream *)std::ostream::flush();
        local_228 = local_218;
        std::__cxx11::string::_M_construct((ulong)&local_228,(char)local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_228,local_220);
        goto LAB_001236ee;
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void RstDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);
	size_t text_len(0);
	stringstream url_data;

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::UList1:
				output << "- ";
				break;
			case Paragraph::Level::OList1:
				output << "#) ";
				break;
			case Paragraph::Level::Quote:
				output << "    ";
				break;
			case Paragraph::Level::Code:
				output << "::" << endl << endl;
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			text_len += l->content().length();
			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`_";
				url_data << ".. _" << l->content() << " : " << url_le->url() << endl;
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << endl << std::string(text_len, '=');
				break;
			case Paragraph::Level::Title2:
				output << endl << std::string(text_len, '-');
				break;
			case Paragraph::Level::Title3:
				output << endl << std::string(text_len, '~');
				break;
			default:
				break;

		}

		text_len = 0;
		output << endl << endl;
	}

	output << url_data.str();
}